

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Parser::LineContents::reset_with_next_line(LineContents *this,csubstr buf,size_t offset)

{
  csubstr stripped__00;
  csubstr full__00;
  Location loc;
  Location loc_00;
  Location loc_01;
  bool bVar1;
  error_flags eVar2;
  char *pcVar3;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  csubstr full_;
  csubstr stripped_;
  char *e;
  char *b;
  size_t rnum_1;
  size_t rnum;
  size_t in_stack_fffffffffffffd98;
  LineContents *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Location *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_substring<const_char> *in_stack_fffffffffffffdc0;
  ulong local_230;
  char (*in_stack_fffffffffffffdf0) [32];
  char (*msg) [21];
  undefined8 in_stack_fffffffffffffe00;
  long *plVar4;
  undefined5 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0d;
  undefined1 in_stack_fffffffffffffe0e;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffe0f;
  undefined8 in_stack_fffffffffffffe10;
  long *plVar6;
  size_t in_stack_fffffffffffffe20;
  LineContents *pLStack_1a8;
  char *local_1a0;
  Location *pLStack_198;
  char *local_190;
  size_t local_178;
  LineContents *pLStack_170;
  char *local_168;
  Location *pLStack_160;
  char *local_158;
  char *local_150;
  size_t local_140;
  LineContents *pLStack_138;
  char *local_130;
  Location *pLStack_128;
  char *local_120;
  long local_108;
  ulong local_100;
  long *local_f8;
  long *local_f0;
  long *local_e8;
  char *local_e0;
  undefined4 local_d8;
  ulong local_d0;
  long *local_c8;
  char *local_c0;
  undefined4 local_b8;
  ulong local_b0;
  char *local_a8;
  undefined4 local_a0;
  char *local_98;
  undefined4 local_90;
  ulong local_88;
  ulong local_80;
  long *local_78;
  char *local_60;
  undefined4 local_58;
  char (*local_50) [21];
  char *local_48;
  undefined4 local_40;
  char *local_38;
  undefined4 local_30;
  char (*local_28) [21];
  ulong local_20;
  long *local_18;
  
  local_108 = in_RSI;
  local_100 = in_RDX;
  if (in_RDX < in_RCX) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                       (size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    loc.super_LineCol.line._0_5_ = in_stack_fffffffffffffe08;
    loc.super_LineCol.offset = in_stack_fffffffffffffe00;
    loc.super_LineCol.line._5_1_ = in_stack_fffffffffffffe0d;
    loc.super_LineCol.line._6_1_ = in_stack_fffffffffffffe0e;
    loc.super_LineCol.line._7_1_ = in_stack_fffffffffffffe0f;
    loc.super_LineCol.col = in_stack_fffffffffffffe10;
    loc.name.str = (char *)in_RDI;
    loc.name.len = in_stack_fffffffffffffe20;
    error<32ul>(in_stack_fffffffffffffdf0,loc);
    in_stack_fffffffffffffd98 = local_140;
    in_stack_fffffffffffffda0 = pLStack_138;
    in_stack_fffffffffffffda8 = local_130;
    in_stack_fffffffffffffdb0 = pLStack_128;
    in_stack_fffffffffffffdb8 = local_120;
  }
  plVar6 = &local_108;
  local_d0 = in_RCX;
  local_c8 = plVar6;
  if (local_100 <= in_RCX) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) &&
       (in_stack_fffffffffffffe0f = is_debugger_attached(), (bool)in_stack_fffffffffffffe0f)) {
      trap_instruction();
    }
    local_e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_d8 = 0x14c3;
    handle_error(0x3fa1ef,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
  }
  pcVar3 = (char *)(*plVar6 + local_d0);
  local_150 = pcVar3;
  while( true ) {
    local_e8 = &local_108;
    uVar5 = false;
    if ((local_150 < (char *)(local_108 + local_100)) &&
       (in_stack_fffffffffffffe0d = false, uVar5 = in_stack_fffffffffffffe0d, *local_150 != '\n')) {
      in_stack_fffffffffffffe0d = *local_150 != '\r';
      uVar5 = in_stack_fffffffffffffe0d;
    }
    if ((bool)uVar5 == false) break;
    local_150 = local_150 + 1;
  }
  if (local_150 < pcVar3) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                       (size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    loc_00.super_LineCol.line._0_5_ = in_stack_fffffffffffffe08;
    loc_00.super_LineCol.offset = in_stack_fffffffffffffe00;
    loc_00.super_LineCol.line._5_1_ = in_stack_fffffffffffffe0d;
    loc_00.super_LineCol.line._6_1_ = uVar5;
    loc_00.super_LineCol.line._7_1_ = in_stack_fffffffffffffe0f;
    loc_00.super_LineCol.col = (size_t)plVar6;
    loc_00.name.str = (char *)in_RDI;
    loc_00.name.len = in_stack_fffffffffffffe20;
    error<21ul>((char (*) [21])in_stack_fffffffffffffdf0,loc_00);
    in_stack_fffffffffffffd98 = local_178;
    in_stack_fffffffffffffda0 = pLStack_170;
    in_stack_fffffffffffffda8 = local_168;
    in_stack_fffffffffffffdb0 = pLStack_160;
    in_stack_fffffffffffffdb8 = local_158;
  }
  local_28 = (char (*) [21])(local_150 + -(long)pcVar3);
  plVar4 = &local_108;
  local_20 = in_RCX;
  local_18 = plVar4;
  if (local_100 < in_RCX) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x153a;
    handle_error(0x3fa1ef,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
  }
  if ((char (*) [21])plVar4[1] < local_28 && local_28 != (char (*) [21])0xffffffffffffffff) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_40 = 0x153b;
    handle_error(0x3fa1ef,(char *)0x153b,"check failed: %s",
                 "(num >= 0 && num <= len) || (num == npos)");
  }
  msg = local_28;
  if (local_28 == (char (*) [21])0xffffffffffffffff) {
    msg = (char (*) [21])(plVar4[1] - local_20);
  }
  local_50 = msg;
  if ((char *)plVar4[1] < *msg + local_20 && local_28 != (char (*) [21])0x0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_60 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_58 = 0x153d;
    handle_error(0x3fa1ef,(char *)0x153d,"check failed: %s",
                 "(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  local_f0 = &local_108;
  if ((local_150 != (char *)(local_108 + local_100)) && (*local_150 == '\r')) {
    local_150 = local_150 + 1;
  }
  local_f8 = &local_108;
  if ((local_150 != (char *)(local_108 + local_100)) && (*local_150 == '\n')) {
    local_150 = local_150 + 1;
  }
  if (local_150 < pcVar3) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                       (size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    loc_01.super_LineCol.line._0_5_ = in_stack_fffffffffffffe08;
    loc_01.super_LineCol.offset = (size_t)plVar4;
    loc_01.super_LineCol.line._5_1_ = in_stack_fffffffffffffe0d;
    loc_01.super_LineCol.line._6_1_ = uVar5;
    loc_01.super_LineCol.line._7_1_ = in_stack_fffffffffffffe0f;
    loc_01.super_LineCol.col = (size_t)plVar6;
    loc_01.name.str = (char *)in_RDI;
    loc_01.name.len = in_stack_fffffffffffffe20;
    error<21ul>(msg,loc_01);
    in_stack_fffffffffffffda0 = pLStack_1a8;
    in_stack_fffffffffffffda8 = local_1a0;
    in_stack_fffffffffffffdb0 = pLStack_198;
    in_stack_fffffffffffffdb8 = local_190;
  }
  local_88 = (long)local_150 - (long)pcVar3;
  local_78 = &local_108;
  local_80 = in_RCX;
  if (local_100 < in_RCX) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_90 = 0x153a;
    handle_error(0x3fa1ef,(char *)0x153a,"check failed: %s","first >= 0 && first <= len");
  }
  if (local_100 < local_88 && local_88 != 0xffffffffffffffff) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_a0 = 0x153b;
    handle_error(0x3fa1ef,(char *)0x153b,"check failed: %s",
                 "(num >= 0 && num <= len) || (num == npos)");
  }
  if (local_88 == 0xffffffffffffffff) {
    local_230 = local_100 - local_80;
  }
  else {
    local_230 = local_88;
  }
  local_b0 = local_230;
  if (local_100 < local_80 + local_230 && local_88 != 0) {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b8 = 0x153d;
    handle_error(0x3fa1ef,(char *)0x153d,"check failed: %s",
                 "(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<const_char>::basic_substring
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  full__00.len = (size_t)in_stack_fffffffffffffdc0;
  full__00.str = in_stack_fffffffffffffdb8;
  stripped__00.len = (size_t)in_stack_fffffffffffffdb0;
  stripped__00.str = in_stack_fffffffffffffda8;
  reset(in_stack_fffffffffffffda0,full__00,stripped__00);
  return;
}

Assistant:

void Parser::LineContents::reset_with_next_line(csubstr buf, size_t offset)
{
    RYML_ASSERT(offset <= buf.len);
    char const* C4_RESTRICT b = &buf[offset];
    char const* C4_RESTRICT e = b;
    // get the current line stripped of newline chars
    while(e < buf.end() && (*e != '\n' && *e != '\r'))
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr stripped_ = buf.sub(offset, static_cast<size_t>(e - b));
    // advance pos to include the first line ending
    if(e != buf.end() && *e == '\r')
        ++e;
    if(e != buf.end() && *e == '\n')
        ++e;
    RYML_ASSERT(e >= b);
    const csubstr full_ = buf.sub(offset, static_cast<size_t>(e - b));
    reset(full_, stripped_);
}